

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

bool __thiscall
QAbstractItemViewPrivate::droppingOnItself
          (QAbstractItemViewPrivate *this,QDropEvent *event,QModelIndex *index)

{
  int iVar1;
  QAbstractItemView *this_00;
  bool bVar2;
  DragDropMode DVar3;
  QAbstractItemView *pQVar4;
  long in_FS_OFFSET;
  QModelIndex local_90;
  QModelIndex local_78;
  QArrayDataPointer<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  iVar1 = *(int *)(event + 0x2c);
  DVar3 = QAbstractItemView::dragDropMode(this_00);
  pQVar4 = (QAbstractItemView *)QDropEvent::source();
  if (pQVar4 == this_00) {
    bVar2 = false;
    if ((((byte)event[0x28] & 2) == 0) || (DVar3 != InternalMove && iVar1 != 2)) goto LAB_004e429c;
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d._0_4_ = 0xaaaaaaaa;
    local_58.d._4_4_ = 0xaaaaaaaa;
    local_58.ptr._0_4_ = 0xaaaaaaaa;
    local_58.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)this_00 + 0x2d8))(&local_58,this_00);
    local_78.r = index->r;
    local_78.c = index->c;
    local_78.i = index->i;
    local_78.m.ptr = (index->m).ptr;
    while (((-1 < local_78.r && (-1 < (long)local_78._0_8_)) &&
           (local_78.m.ptr != (QAbstractItemModel *)0x0))) {
      bVar2 = ::operator!=(&local_78,&this->root);
      if (!bVar2) break;
      bVar2 = QListSpecialMethodsBase<QModelIndex>::contains<QModelIndex>
                        ((QListSpecialMethodsBase<QModelIndex> *)&local_58,&local_78);
      if (bVar2) {
        QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
        bVar2 = true;
        goto LAB_004e429c;
      }
      QModelIndex::parent(&local_90,&local_78);
      local_78.r = local_90.r;
      local_78.c = local_90.c;
      local_78.i = local_90.i;
      local_78.m.ptr = local_90.m.ptr;
    }
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
  }
  bVar2 = false;
LAB_004e429c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemViewPrivate::droppingOnItself(QDropEvent *event, const QModelIndex &index)
{
    Q_Q(QAbstractItemView);
    Qt::DropAction dropAction = event->dropAction();
    if (q->dragDropMode() == QAbstractItemView::InternalMove)
        dropAction = Qt::MoveAction;
    if (event->source() == q
        && event->possibleActions() & Qt::MoveAction
        && dropAction == Qt::MoveAction) {
        QModelIndexList selectedIndexes = q->selectedIndexes();
        QModelIndex child = index;
        while (child.isValid() && child != root) {
            if (selectedIndexes.contains(child))
                return true;
            child = child.parent();
        }
    }
    return false;
}